

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O2

bool __thiscall FC_BPNN::Backward(FC_BPNN *this)

{
  ulong uVar1;
  pointer pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pointer pvVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  uint uVar10;
  int j;
  long lVar11;
  
  uVar1 = ((long)(this->net).
                 super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->net).
                super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30 & 0xffffffff;
  while( true ) {
    uVar7 = uVar1;
    uVar1 = uVar7 - 1;
    uVar10 = (uint)uVar1;
    if ((int)uVar10 < 0) break;
    uVar10 = uVar10 & 0x7fffffff;
    pmVar2 = (this->net).
             super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (p_Var9 = *(_Base_ptr *)((long)&pmVar2[uVar10]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var9 != &pmVar2[uVar10]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      p_Var3 = p_Var9[1]._M_parent;
      p_Var3[4]._M_left =
           *(_Base_ptr *)
            (*(long *)&(this->layers_error).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + (ulong)p_Var9[1]._M_color * 8);
      plVar8 = (long *)__dynamic_cast(p_Var3,&Preceptron::typeinfo,&Preceptron_SIGMOID::typeinfo,0);
      (**(code **)(*plVar8 + 0x20))(plVar8);
      p_Var3 = p_Var9[1]._M_parent[1]._M_parent;
      p_Var4 = p_Var9[1]._M_parent[1]._M_left;
      pvVar5 = (this->layers_error).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar11 = 0; (long)p_Var4 - (long)p_Var3 >> 3 != lVar11; lVar11 = lVar11 + 1) {
        lVar6 = *(long *)&pvVar5[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        *(double *)(lVar6 + lVar11 * 8) =
             *(double *)(&p_Var3->_M_color + lVar11 * 2) + *(double *)(lVar6 + lVar11 * 8);
      }
    }
  }
  return true;
}

Assistant:

bool FC_BPNN::Backward()
{
	for (int i = net.size() - 1; i >= 0; i--) {
		for (auto& element : net[i]) {
			size_t finder = element.first;
			size_t finder1 = finder & 0X00000000FFFFFFFF;
			element.second->error = layers_error[i + 1][finder1];
			dynamic_cast<Preceptron_SIGMOID*>(element.second)->Backward();
			for (int j = 0; j < element.second->delta_weight.size(); j++) {
				layers_error[i][j] += element.second->delta_weight[j];
			}
		}
	}
	return true;
}